

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O0

int __thiscall Path::mkdir(Path *this,char *__path,__mode_t __mode)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  int *piVar4;
  char *pcVar5;
  size_t sVar6;
  int *piStack_1038;
  int r;
  size_t i;
  size_t len;
  char buf [4098];
  mode_t permissions_local;
  MkDirMode mkdirMode_local;
  Path *path_local;
  
  unique0x100001cd = __mode;
  piVar4 = __errno_location();
  *piVar4 = 0;
  pcVar5 = String::constData(&this->super_String);
  uVar2 = ::mkdir(pcVar5,stack0xffffffffffffffe0);
  piStack_1038 = (int *)(ulong)uVar2;
  if (uVar2 != 0) {
    piStack_1038 = __errno_location();
    if (*piStack_1038 != 0x11) {
      piStack_1038 = __errno_location();
      if (*piStack_1038 != 0x15) {
        if ((int)__path == 0) {
          path_local._7_1_ = 0;
        }
        else {
          piStack_1038 = (int *)String::size(&this->super_String);
          if (piStack_1038 < (int *)0x1001) {
            pcVar5 = String::constData(&this->super_String);
            strcpy((char *)&len,pcVar5);
            sVar6 = String::size(&this->super_String);
            bVar1 = String::endsWith(&this->super_String,'/',CaseSensitive);
            i = sVar6;
            if (!bVar1) {
              i = sVar6 + 1;
              buf[sVar6 - 8] = '/';
              buf[sVar6 - 7] = '\0';
            }
            for (piStack_1038 = (int *)0x1; piStack_1038 < i;
                piStack_1038 = (int *)((long)piStack_1038 + 1)) {
              if (*(char *)((long)&len + (long)piStack_1038) == '/') {
                *(undefined1 *)((long)&len + (long)piStack_1038) = 0;
                iVar3 = ::mkdir((char *)&len,stack0xffffffffffffffe0);
                if (iVar3 != 0) {
                  piVar4 = __errno_location();
                  if (*piVar4 != 0x11) {
                    piVar4 = __errno_location();
                    if (*piVar4 != 0x15) {
                      path_local._7_1_ = 0;
                      piStack_1038 = piVar4;
                      goto LAB_0025243b;
                    }
                  }
                }
                *(undefined1 *)((long)&len + (long)piStack_1038) = 0x2f;
              }
            }
            path_local._7_1_ = 1;
          }
          else {
            path_local._7_1_ = 0;
          }
        }
        goto LAB_0025243b;
      }
    }
  }
  path_local._7_1_ = 1;
LAB_0025243b:
  return (int)CONCAT71((int7)((ulong)piStack_1038 >> 8),path_local._7_1_);
}

Assistant:

bool Path::mkdir(const Path &path, MkDirMode mkdirMode, mode_t permissions)
{
    errno = 0;
#ifdef _WIN32
    (void) permissions;   // unused on windows
    if (!::_wmkdir(Utf8To16(path.c_str())) || errno == EEXIST)
#else
    if (!::mkdir(path.constData(), permissions) || errno == EEXIST || errno == EISDIR)
#endif
    {
        // mkdir call succeeded or it failed because the dir already exists
        return true;
    }
    if (mkdirMode == Single)
        return false;
    if (path.size() > PATH_MAX)
        return false;

    // directory creation failed so far
    // because mkdirMode == Recursive, we go along the path and create
    // directories, continuing while dir creation is successful or it failed
    // only because directories already exist.

    char buf[PATH_MAX + 2];
    strcpy(buf, path.constData());
    size_t len = path.size();
    if (!path.endsWith('/')) {
        buf[len++] = '/';
        buf[len] = '\0';
    }

    for (size_t i = 1; i < len; ++i) {
        if (buf[i] == '/') {
            buf[i] = 0;
#ifdef _WIN32
            Utf8To16 tmp2(buf);
            const int r = ::_wmkdir(tmp2);
#else
            const int r = ::mkdir(buf, permissions);
#endif
            if (r && errno != EEXIST && errno != EISDIR)
                return false;
            buf[i] = '/';
        }
    }
    return true;
}